

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O1

Vec_Ptr_t * Ptr_AbcDeriveNtk(Abc_Ntk_t *pNtk)

{
  char *pcVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  Vec_Ptr_t *pVVar4;
  undefined8 *puVar5;
  
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 5;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(0x28);
  pVVar2->pArray = ppvVar3;
  pcVar1 = pNtk->pName;
  pVVar2->nSize = 1;
  *ppvVar3 = pcVar1;
  pVVar4 = Ptr_AbcDeriveInputs(pNtk);
  if (pVVar2->nCap == 1) {
    ppvVar3 = (void **)realloc(ppvVar3,0x80);
    pVVar2->pArray = ppvVar3;
    pVVar2->nCap = 0x10;
  }
  ppvVar3 = pVVar2->pArray;
  pVVar2->nSize = 2;
  ppvVar3[1] = pVVar4;
  pVVar4 = Ptr_AbcDeriveOutputs(pNtk);
  if (pVVar2->nCap == 2) {
    if (ppvVar3 == (void **)0x0) {
      ppvVar3 = (void **)malloc(0x80);
    }
    else {
      ppvVar3 = (void **)realloc(ppvVar3,0x80);
    }
    pVVar2->pArray = ppvVar3;
    pVVar2->nCap = 0x10;
  }
  ppvVar3 = pVVar2->pArray;
  pVVar2->nSize = 3;
  ppvVar3[2] = pVVar4;
  puVar5 = (undefined8 *)malloc(0x10);
  *puVar5 = 0;
  puVar5[1] = 0;
  if (pVVar2->nCap == 3) {
    if (ppvVar3 == (void **)0x0) {
      ppvVar3 = (void **)malloc(0x80);
    }
    else {
      ppvVar3 = (void **)realloc(ppvVar3,0x80);
    }
    pVVar2->pArray = ppvVar3;
    pVVar2->nCap = 0x10;
  }
  ppvVar3 = pVVar2->pArray;
  pVVar2->nSize = 4;
  ppvVar3[3] = puVar5;
  pVVar4 = Ptr_AbcDeriveBoxes(pNtk);
  if (pVVar2->nCap == 4) {
    if (ppvVar3 == (void **)0x0) {
      ppvVar3 = (void **)malloc(0x80);
    }
    else {
      ppvVar3 = (void **)realloc(ppvVar3,0x80);
    }
    pVVar2->pArray = ppvVar3;
    pVVar2->nCap = 0x10;
  }
  pVVar2->nSize = 5;
  pVVar2->pArray[4] = pVVar4;
  if (pVVar2->nCap == 5) {
    return pVVar2;
  }
  __assert_fail("Vec_PtrSize(vArray) == Vec_PtrCap(vArray)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacPtrAbc.c"
                ,0x6b,"int Ptr_CheckArray(Vec_Ptr_t *)");
}

Assistant:

Vec_Ptr_t * Ptr_AbcDeriveNtk( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNtk = Vec_PtrAllocExact( 5 );
    Vec_PtrPush( vNtk, Abc_NtkName(pNtk) );
    Vec_PtrPush( vNtk, Ptr_AbcDeriveInputs(pNtk) );
    Vec_PtrPush( vNtk, Ptr_AbcDeriveOutputs(pNtk) );
    Vec_PtrPush( vNtk, Vec_PtrAllocExact(0) );
    Vec_PtrPush( vNtk, Ptr_AbcDeriveBoxes(pNtk) );
    assert( Ptr_CheckArray(vNtk) );
    return vNtk;
}